

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O0

void template_clear(void)

{
  int iVar1;
  void *__ptr;
  void *filename;
  int i;
  
  filename._4_4_ = 1;
  while( true ) {
    iVar1 = Fl_Browser::size(template_browser);
    if (iVar1 < filename._4_4_) break;
    __ptr = Fl_Browser::data(template_browser,filename._4_4_);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    filename._4_4_ = filename._4_4_ + 1;
  }
  Fl_Browser_::deselect(&template_browser->super_Fl_Browser_,0);
  Fl_Browser::clear(template_browser);
  return;
}

Assistant:

void template_clear() {
  int i;
  void *filename;
  
  for (i = 1; i <= template_browser->size(); i ++) {
    if ((filename = template_browser->data(i)) != NULL) free(filename);
  }
  
  template_browser->deselect();
  template_browser->clear();
}